

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::memory::anon_unknown_0::AllocateFreeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,AllocateFreeTestInstance *this)

{
  VkMemoryHeap *pVVar1;
  uint uVar2;
  DeviceInterface *pDVar3;
  DeviceInterface *pDVar4;
  bool bVar5;
  VkResult VVar6;
  deBool dVar7;
  qpTestResult code;
  TestContext *this_00;
  MessageBuilder *pMVar8;
  float *pfVar9;
  unsigned_long *puVar10;
  ulong uVar11;
  NotSupportedError *this_01;
  reference pvVar12;
  TestError *pTVar13;
  size_type sVar14;
  float local_ec4;
  pointer local_eb8;
  string local_e10 [2];
  TestError *error;
  VkDeviceMemory mem_2;
  size_t ndx_4;
  deUint64 local_d98;
  undefined4 local_d90 [2];
  VkMemoryAllocateInfo alloc_1;
  size_t ndx_3;
  deUint64 local_d60;
  deUint64 local_d58;
  VkDeviceMemory mem_1;
  size_t ndx_2;
  deUint64 local_d40;
  deUint64 local_d38;
  VkDeviceMemory mem;
  size_t ndx_1;
  VkMemoryAllocateInfo alloc;
  size_t ndx;
  MessageBuilder local_b80;
  allocator<char> local_9f9;
  string local_9f8;
  MessageBuilder local_9d8;
  allocator<vk::Handle<(vk::HandleType)7>_> local_851;
  Handle<(vk::HandleType)7> local_850;
  undefined1 local_848 [8];
  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
  memoryObjects;
  VkDeviceSize allocationSize;
  VkMemoryHeap memoryHeap;
  VkMemoryType local_810;
  VkMemoryType memoryType;
  MessageBuilder local_688;
  MessageBuilder local_508;
  byte local_385;
  float local_384;
  string local_380;
  string local_360;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  DeviceInterface *local_30;
  DeviceInterface *vkd;
  VkDevice device;
  TestLog *log;
  AllocateFreeTestInstance *this_local;
  
  log = (TestLog *)this;
  this_local = (AllocateFreeTestInstance *)__return_storage_ptr__;
  this_00 = vkt::Context::getTestContext((this->super_TestInstance).m_context);
  device = (VkDevice)tcu::TestContext::getLog(this_00);
  vkd = (DeviceInterface *)vkt::Context::getDevice((this->super_TestInstance).m_context);
  local_30 = vkt::Context::getDeviceInterface((this->super_TestInstance).m_context);
  if (this->m_memoryTypeIndex == 0) {
    tcu::TestLog::operator<<
              (&local_1b0,(TestLog *)device,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [26])"Memory allocation count: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&(this->m_config).memoryAllocationCount);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    tcu::TestLog::operator<<
              (&local_340,(TestLog *)device,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [25])"Single allocation size: ");
    local_385 = 0;
    bVar5 = tcu::Maybe::operator_cast_to_bool((Maybe *)&this->m_config);
    if (bVar5) {
      puVar10 = tcu::Maybe<unsigned_long>::operator*(&(this->m_config).memorySize);
      de::toString<unsigned_long>(&local_360,puVar10);
    }
    else {
      pfVar9 = tcu::Maybe<float>::operator*(&(this->m_config).memoryPercentage);
      local_384 = *pfVar9 * 100.0;
      de::toString<float>(&local_380,&local_384);
      local_385 = 1;
      std::operator+(&local_360,&local_380," percent of the heap size.");
    }
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_360);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_360);
    if ((local_385 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_380);
    }
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    if ((this->m_config).order == ALLOC_REVERSE_FREE) {
      tcu::TestLog::operator<<
                (&local_508,(TestLog *)device,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_508,(char (*) [36])"Memory is freed in reversed order. ");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_508);
    }
    else if ((this->m_config).order == ALLOC_FREE) {
      tcu::TestLog::operator<<
                (&local_688,(TestLog *)device,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_688,(char (*) [45])"Memory is freed in same order as allocated. ");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_688);
    }
    else if ((this->m_config).order == MIXED_ALLOC_FREE) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&memoryType,(TestLog *)device,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&memoryType,
                          (char (*) [41])"Memory is freed right after allocation. ");
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&memoryType);
    }
  }
  local_810 = (this->m_memoryProperties).memoryTypes[this->m_memoryTypeIndex];
  pVVar1 = (this->m_memoryProperties).memoryHeaps + ((ulong)local_810 >> 0x20);
  allocationSize = pVVar1->size;
  memoryHeap.size = *(VkDeviceSize *)&pVVar1->flags;
  bVar5 = tcu::Maybe::operator_cast_to_bool((Maybe *)&this->m_config);
  if (bVar5) {
    puVar10 = tcu::Maybe<unsigned_long>::operator*(&(this->m_config).memorySize);
    local_eb8 = (pointer)*puVar10;
  }
  else {
    pfVar9 = tcu::Maybe<float>::operator*(&(this->m_config).memoryPercentage);
    local_ec4 = (float)allocationSize;
    uVar11 = (ulong)(*pfVar9 * local_ec4);
    local_eb8 = (pointer)(uVar11 | (long)(*pfVar9 * local_ec4 - 9.223372e+18) & (long)uVar11 >> 0x3f
                         );
  }
  memoryObjects.
  super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_eb8;
  uVar2 = (this->m_config).memoryAllocationCount;
  ::vk::Handle<(vk::HandleType)7>::Handle(&local_850,0);
  std::allocator<vk::Handle<(vk::HandleType)7>_>::allocator(&local_851);
  std::vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_> *)
         local_848,(ulong)uVar2,&local_850,&local_851);
  std::allocator<vk::Handle<(vk::HandleType)7>_>::~allocator(&local_851);
  tcu::TestLog::operator<<(&local_9d8,(TestLog *)device,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar8 = tcu::MessageBuilder::operator<<(&local_9d8,(char (*) [20])"Memory type index: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_memoryTypeIndex);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_9d8);
  if ((this->m_memoryProperties).memoryHeapCount <= local_810.heapIndex) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f8,"Invalid heap index defined for memory type.",&local_9f9);
    tcu::ResultCollector::fail(&this->m_result,&local_9f8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::allocator<char>::~allocator(&local_9f9);
  }
  tcu::TestLog::operator<<(&local_b80,(TestLog *)device,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar8 = tcu::MessageBuilder::operator<<(&local_b80,(char (*) [14])"Memory type: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_810);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_b80);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ndx,(TestLog *)device,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)&ndx,(char (*) [14])"Memory heap: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(VkMemoryHeap *)&allocationSize);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx);
  if (allocationSize <
      (long)memoryObjects.
            super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage *
      (ulong)(this->m_config).memoryAllocationCount * 8) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Memory heap doesn\'t have enough memory.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
               ,0x98);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (((this->m_config).order == ALLOC_FREE) || ((this->m_config).order == ALLOC_REVERSE_FREE)) {
    alloc.memoryTypeIndex = 0;
    alloc._28_4_ = 0;
    for (; pDVar4 = vkd, pDVar3 = local_30,
        (ulong)alloc._24_8_ < (ulong)(this->m_config).memoryAllocationCount;
        alloc._24_8_ = alloc._24_8_ + 1) {
      ndx_1._0_4_ = 5;
      alloc.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      alloc._4_4_ = 0;
      alloc.pNext = memoryObjects.
                    super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      alloc.allocationSize._0_4_ = this->m_memoryTypeIndex;
      pvVar12 = std::
                vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                              *)local_848,alloc._24_8_);
      VVar6 = (*pDVar3->_vptr_DeviceInterface[5])(pDVar3,pDVar4,&ndx_1,0,pvVar12);
      ::vk::checkResult(VVar6,
                        "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                        ,0xa8);
      do {
        dVar7 = ::deGetFalse();
        if (dVar7 != 0) {
LAB_00bdd0b5:
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar13,(char *)0x0,"!!memoryObjects[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                     ,0xaa);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pvVar12 = std::
                  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                *)local_848,alloc._24_8_);
        bVar5 = ::vk::Handle<(vk::HandleType)7>::operator!(pvVar12);
        if (bVar5) goto LAB_00bdd0b5;
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
    }
    if ((this->m_config).order == ALLOC_FREE) {
      for (mem.m_internal = 0; mem.m_internal < (this->m_config).memoryAllocationCount;
          mem.m_internal = mem.m_internal + 1) {
        sVar14 = std::
                 vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                 ::size((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                         *)local_848);
        pvVar12 = std::
                  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                *)local_848,~mem.m_internal + sVar14);
        local_d40 = pvVar12->m_internal;
        local_d38 = local_d40;
        (*local_30->_vptr_DeviceInterface[6])(local_30,vkd,local_d40,0);
        ::vk::Handle<(vk::HandleType)7>::Handle((Handle<(vk::HandleType)7> *)&ndx_2,0);
        sVar14 = std::
                 vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                 ::size((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                         *)local_848);
        pvVar12 = std::
                  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                *)local_848,(sVar14 - 1) - mem.m_internal);
        pvVar12->m_internal = ndx_2;
      }
    }
    else {
      for (mem_1.m_internal = 0; mem_1.m_internal < (this->m_config).memoryAllocationCount;
          mem_1.m_internal = mem_1.m_internal + 1) {
        pvVar12 = std::
                  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                *)local_848,mem_1.m_internal);
        local_d60 = pvVar12->m_internal;
        local_d58 = local_d60;
        (*local_30->_vptr_DeviceInterface[6])(local_30,vkd,local_d60,0);
        ::vk::Handle<(vk::HandleType)7>::Handle((Handle<(vk::HandleType)7> *)&ndx_3,0);
        pvVar12 = std::
                  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                *)local_848,mem_1.m_internal);
        pvVar12->m_internal = ndx_3;
      }
    }
  }
  else {
    alloc_1.memoryTypeIndex = 0;
    alloc_1._28_4_ = 0;
    for (; pDVar4 = vkd, pDVar3 = local_30,
        (ulong)alloc_1._24_8_ < (ulong)(this->m_config).memoryAllocationCount;
        alloc_1._24_8_ = alloc_1._24_8_ + 1) {
      local_d90[0] = 5;
      alloc_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      alloc_1._4_4_ = 0;
      alloc_1.pNext =
           memoryObjects.
           super__Vector_base<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      alloc_1.allocationSize._0_4_ = this->m_memoryTypeIndex;
      pvVar12 = std::
                vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                              *)local_848,alloc_1._24_8_);
      VVar6 = (*pDVar3->_vptr_DeviceInterface[5])(pDVar3,pDVar4,local_d90,0,pvVar12);
      ::vk::checkResult(VVar6,
                        "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                        ,0xce);
      do {
        dVar7 = ::deGetFalse();
        if (dVar7 != 0) {
LAB_00bdd443:
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar13,(char *)0x0,"!!memoryObjects[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                     ,0xcf);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pvVar12 = std::
                  vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                  ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                                *)local_848,alloc_1._24_8_);
        bVar5 = ::vk::Handle<(vk::HandleType)7>::operator!(pvVar12);
        if (bVar5) goto LAB_00bdd443;
        dVar7 = ::deGetFalse();
        pDVar4 = vkd;
        pDVar3 = local_30;
      } while (dVar7 != 0);
      pvVar12 = std::
                vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                              *)local_848,alloc_1._24_8_);
      local_d98 = pvVar12->m_internal;
      (*pDVar3->_vptr_DeviceInterface[6])(pDVar3,pDVar4,local_d98,0);
      ::vk::Handle<(vk::HandleType)7>::Handle((Handle<(vk::HandleType)7> *)&ndx_4,0);
      pvVar12 = std::
                vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                ::operator[]((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>
                              *)local_848,alloc_1._24_8_);
      pvVar12->m_internal = ndx_4;
    }
  }
  std::vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_>::
  ~vector((vector<vk::Handle<(vk::HandleType)7>,_std::allocator<vk::Handle<(vk::HandleType)7>_>_> *)
          local_848);
  this->m_memoryTypeIndex = this->m_memoryTypeIndex + 1;
  if (this->m_memoryTypeIndex < (this->m_memoryProperties).memoryTypeCount) {
    tcu::TestStatus::incomplete();
  }
  else {
    code = tcu::ResultCollector::getResult(&this->m_result);
    tcu::ResultCollector::getMessage_abi_cxx11_(local_e10,&this->m_result);
    tcu::TestStatus::TestStatus(__return_storage_ptr__,code,local_e10);
    std::__cxx11::string::~string((string *)local_e10);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus AllocateFreeTestInstance::iterate (void)
{
	TestLog&								log					= m_context.getTestContext().getLog();
	const VkDevice							device				= m_context.getDevice();
	const DeviceInterface&					vkd					= m_context.getDeviceInterface();

	DE_ASSERT(m_config.memoryAllocationCount <= MAX_ALLOCATION_COUNT);

	if (m_memoryTypeIndex == 0)
	{
		log << TestLog::Message << "Memory allocation count: " << m_config.memoryAllocationCount << TestLog::EndMessage;
		log << TestLog::Message << "Single allocation size: " << (m_config.memorySize ? de::toString(*m_config.memorySize) : de::toString(100.0f * (*m_config.memoryPercentage)) + " percent of the heap size.") << TestLog::EndMessage;

		if (m_config.order == TestConfig::ALLOC_REVERSE_FREE)
			log << TestLog::Message << "Memory is freed in reversed order. " << TestLog::EndMessage;
		else if (m_config.order == TestConfig::ALLOC_FREE)
			log << TestLog::Message << "Memory is freed in same order as allocated. " << TestLog::EndMessage;
		else if (m_config.order == TestConfig::MIXED_ALLOC_FREE)
			log << TestLog::Message << "Memory is freed right after allocation. " << TestLog::EndMessage;
		else
			DE_FATAL("Unknown allocation order");
	}

	try
	{
		const VkMemoryType		memoryType		= m_memoryProperties.memoryTypes[m_memoryTypeIndex];
		const VkMemoryHeap		memoryHeap		= m_memoryProperties.memoryHeaps[memoryType.heapIndex];

		const VkDeviceSize		allocationSize	= (m_config.memorySize ? *m_config.memorySize : (VkDeviceSize)(*m_config.memoryPercentage * (float)memoryHeap.size));
		vector<VkDeviceMemory>	memoryObjects	(m_config.memoryAllocationCount, (VkDeviceMemory)0);

		log << TestLog::Message << "Memory type index: " << m_memoryTypeIndex << TestLog::EndMessage;

		if (memoryType.heapIndex >= m_memoryProperties.memoryHeapCount)
			m_result.fail("Invalid heap index defined for memory type.");

		{
			log << TestLog::Message << "Memory type: " << memoryType << TestLog::EndMessage;
			log << TestLog::Message << "Memory heap: " << memoryHeap << TestLog::EndMessage;

			if (allocationSize * m_config.memoryAllocationCount * 8 > memoryHeap.size)
				TCU_THROW(NotSupportedError, "Memory heap doesn't have enough memory.");

			try
			{
				if (m_config.order == TestConfig::ALLOC_FREE || m_config.order == TestConfig::ALLOC_REVERSE_FREE)
				{
					for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
					{
						const VkMemoryAllocateInfo alloc =
						{
							VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
							DE_NULL,								// pNext
							allocationSize,							// allocationSize
							m_memoryTypeIndex						// memoryTypeIndex;
						};

						VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx]));

						TCU_CHECK(!!memoryObjects[ndx]);
					}

					if (m_config.order == TestConfig::ALLOC_FREE)
					{
						for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
						{
							const VkDeviceMemory mem = memoryObjects[memoryObjects.size() - 1 - ndx];

							vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
							memoryObjects[memoryObjects.size() - 1 - ndx] = (VkDeviceMemory)0;
						}
					}
					else
					{
						for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
						{
							const VkDeviceMemory mem = memoryObjects[ndx];

							vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
							memoryObjects[ndx] = (VkDeviceMemory)0;
						}
					}
				}
				else
				{
					for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
					{
						const VkMemoryAllocateInfo alloc =
						{
							VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
							DE_NULL,								// pNext
							allocationSize,							// allocationSize
							m_memoryTypeIndex						// memoryTypeIndex;
						};

						VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &memoryObjects[ndx]));
						TCU_CHECK(!!memoryObjects[ndx]);

						vkd.freeMemory(device, memoryObjects[ndx], (const VkAllocationCallbacks*)DE_NULL);
						memoryObjects[ndx] = (VkDeviceMemory)0;
					}
				}
			}
			catch (...)
			{
				for (size_t ndx = 0; ndx < m_config.memoryAllocationCount; ndx++)
				{
					const VkDeviceMemory mem = memoryObjects[ndx];

					if (!!mem)
					{
						vkd.freeMemory(device, mem, (const VkAllocationCallbacks*)DE_NULL);
						memoryObjects[ndx] = (VkDeviceMemory)0;
					}
				}

				throw;
			}
		}
	}
	catch (const tcu::TestError& error)
	{
		m_result.fail(error.getMessage());
	}

	m_memoryTypeIndex++;

	if (m_memoryTypeIndex < m_memoryProperties.memoryTypeCount)
		return tcu::TestStatus::incomplete();
	else
		return tcu::TestStatus(m_result.getResult(), m_result.getMessage());
}